

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFontGlyph * __thiscall ImFont::FindGlyphNoFallback(ImFont *this,ImWchar c)

{
  ushort uVar1;
  ImFontGlyph *pIVar2;
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,c) < (this->IndexLookup).Size) {
    uVar1 = (this->IndexLookup).Data[c];
    pIVar2 = (ImFontGlyph *)0x0;
    if (uVar1 != 0xffff) {
      pIVar2 = (ImFontGlyph *)
               ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
    }
    return pIVar2;
  }
  return (ImFontGlyph *)0x0;
}

Assistant:

const ImFontGlyph* ImFont::FindGlyphNoFallback(ImWchar c) const
{
    if (c >= IndexLookup.Size)
        return NULL;
    const unsigned short i = IndexLookup[c];
    if (i == (unsigned short)-1)
        return NULL;
    return &Glyphs.Data[i];
}